

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O1

string * __thiscall
MinVR::VRDataQueue::printQueue_abi_cxx11_(string *__return_storage_ptr__,VRDataQueue *this)

{
  size_t sVar1;
  long *plVar2;
  undefined8 *puVar3;
  _Base_ptr p_Var4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  string identifier;
  char buf [6];
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  string *local_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80 [2];
  long local_70 [2];
  char local_5e [6];
  long *local_58 [2];
  long local_48 [2];
  _Rb_tree_node_base *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var4 = (this->_dataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(this->_dataMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_108 = __return_storage_ptr__;
  if (p_Var4 != local_38) {
    uVar7 = 1;
    do {
      sprintf(local_5e,"%d",uVar7);
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"element","");
      std::__cxx11::string::append((char *)local_80);
      local_58[0] = local_48;
      sVar1 = strlen(local_5e);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,local_5e,local_5e + sVar1);
      plVar2 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_58,0,(char *)0x0,(ulong)local_80[0]);
      local_c0 = &local_b0;
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_b0 = *plVar5;
        lStack_a8 = plVar2[3];
      }
      else {
        local_b0 = *plVar5;
        local_c0 = (long *)*plVar2;
      }
      local_b8 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
      local_100 = &local_f0;
      puVar6 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar6) {
        local_f0 = *puVar6;
        lStack_e8 = plVar2[3];
      }
      else {
        local_f0 = *puVar6;
        local_100 = (ulong *)*plVar2;
      }
      local_f8 = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      VRDataQueueItem::serialize_abi_cxx11_(&local_e0,(VRDataQueueItem *)&p_Var4[1]._M_left);
      uVar8 = 0xf;
      if (local_100 != &local_f0) {
        uVar8 = local_f0;
      }
      if (uVar8 < local_e0._M_string_length + local_f8) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar9 = local_e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_e0._M_string_length + local_f8) goto LAB_0013dc79;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
      }
      else {
LAB_0013dc79:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
      }
      local_128 = &local_118;
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        local_118 = *plVar2;
        uStack_110 = puVar3[3];
      }
      else {
        local_118 = *plVar2;
        local_128 = (long *)*puVar3;
      }
      local_120 = puVar3[1];
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)plVar2 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_128);
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_90 = *plVar5;
        lStack_88 = plVar2[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar5;
        local_a0 = (long *)*plVar2;
      }
      local_98 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_108,(ulong)local_a0);
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128,local_118 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0 + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (p_Var4 != local_38);
  }
  return local_108;
}

Assistant:

std::string VRDataQueue::printQueue() const {

  std::string out;

  char buf[6];  // No queues more than a million entries long.
  int i = 0;
  for (VRDataList::const_iterator it = _dataMap.begin();
       it != _dataMap.end(); ++it) {
    sprintf(buf, "%d", ++i);
    std::string identifier = "element";
    if (it->second.isSerialized()) {
      identifier += "*";
    } else {
      identifier += " ";
    }
    out += identifier + std::string(buf) + ": " + it->second.serialize() + "\n";
  }

  return out;
}